

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# postproc_filters_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::PostprocFiltersTest_MD5Match_Test::~PostprocFiltersTest_MD5Match_Test
          (PostprocFiltersTest_MD5Match_Test *this)

{
  PostprocFiltersTest_MD5Match_Test *in_stack_00000010;
  
  anon_unknown.dwarf_c82961::PostprocFiltersTest_MD5Match_Test::~PostprocFiltersTest_MD5Match_Test
            (in_stack_00000010);
  return;
}

Assistant:

TEST_P(PostprocFiltersTest, MD5Match) { DoTest(); }